

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,ExtensionInfo *extension,CodedInputStream *input,
          FieldSkipper *field_skipper)

{
  uint8 uVar1;
  uint8 *puVar2;
  double *pdVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Limit limit;
  LogMessage *other;
  string *psVar8;
  MessageLite *pMVar9;
  FieldType FVar10;
  LogLevel LVar11;
  double dVar12;
  FieldDescriptor *pFVar13;
  int value_2;
  uint32 value;
  uint32 size;
  LogMessage local_78;
  LogFinisher local_39;
  uint32 local_38;
  Limit local_34;
  
  if (extension->is_packed == true) {
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      local_38 = (int)(char)uVar1;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_38);
      if (!bVar5) {
        return false;
      }
    }
    local_34 = io::CodedInputStream::PushLimit(input,local_38);
    switch(extension->type) {
    case '\x01':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        pdVar3 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
          bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_78);
        }
        else {
          local_78._0_8_ = *pdVar3;
          input->buffer_ = (uint8 *)(pdVar3 + 1);
          bVar5 = true;
        }
        if (bVar5 == false) {
          return false;
        }
        AddDouble(this,number,'\x01',true,(double)local_78._0_8_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x02':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar2 < 4) {
          bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
        }
        else {
          local_78._4_4_ = SUB84((ulong)local_78._0_8_ >> 0x20,0);
          local_78.level_ = *(undefined4 *)puVar2;
          input->buffer_ = puVar2 + 4;
          bVar5 = true;
        }
        if (bVar5 == false) {
          return false;
        }
        AddFloat(this,number,'\x02',true,(float)local_78.level_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x03':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          bVar5 = true;
          local_78._0_8_ = (long)(char)uVar1;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_78);
        }
        if (bVar5 == false) {
          return false;
        }
        AddInt64(this,number,'\x03',true,local_78._0_8_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x04':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          local_78._0_8_ = (long)(char)uVar1;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_78);
          if (!bVar5) {
            return false;
          }
        }
        AddUInt64(this,number,'\x04',true,local_78._0_8_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x05':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
          local_78._4_4_ = SUB84((ulong)local_78._0_8_ >> 0x20,0);
          local_78.level_ = (int)(char)*puVar2;
          input->buffer_ = puVar2 + 1;
          bVar5 = true;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
        }
        if (bVar5 == false) {
          return false;
        }
        AddInt32(this,number,'\x05',true,local_78.level_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x06':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        pdVar3 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
          bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_78);
          if (!bVar5) {
            return false;
          }
        }
        else {
          local_78._0_8_ = *pdVar3;
          input->buffer_ = (uint8 *)(pdVar3 + 1);
        }
        AddUInt64(this,number,'\x06',true,local_78._0_8_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\a':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar2 < 4) {
          bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
          if (!bVar5) {
            return false;
          }
        }
        else {
          local_78._4_4_ = SUB84((ulong)local_78._0_8_ >> 0x20,0);
          local_78.level_ = *(undefined4 *)puVar2;
          input->buffer_ = puVar2 + 4;
        }
        AddUInt32(this,number,'\a',true,local_78.level_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\b':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
          local_78._4_4_ = SUB84((ulong)local_78._0_8_ >> 0x20,0);
          local_78.level_ = (int)(char)*puVar2;
          input->buffer_ = puVar2 + 1;
          bVar5 = true;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
        }
        if (bVar5 == false) {
          return false;
        }
        AddBool(this,number,'\b',true,local_78.level_ != LOGLEVEL_INFO,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x3ae);
      other = LogMessage::operator<<(&local_78,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_39,other);
      LogMessage::~LogMessage(&local_78);
      break;
    case '\r':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
          local_78._4_4_ = SUB84((ulong)local_78._0_8_ >> 0x20,0);
          local_78.level_ = (int)(char)*puVar2;
          input->buffer_ = puVar2 + 1;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
          if (!bVar5) {
            return false;
          }
        }
        AddUInt32(this,number,'\r',true,local_78.level_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x0e':
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
          local_78.level_ = (int)(char)*puVar2;
          input->buffer_ = puVar2 + 1;
          bVar5 = true;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
        }
        if (bVar5 == false) {
          return false;
        }
        iVar7 = local_78.level_;
        bVar6 = (*(extension->field_3).enum_validity_check.func)
                          ((extension->field_3).enum_validity_check.arg,iVar7);
        if (bVar6) {
          AddEnum(this,number,'\x0e',true,iVar7,extension->descriptor);
        }
        if (bVar5 == false) {
          return false;
        }
      }
      break;
    case '\x0f':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar2 < 4) {
          bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
        }
        else {
          local_78._4_4_ = SUB84((ulong)local_78._0_8_ >> 0x20,0);
          local_78.level_ = *(undefined4 *)puVar2;
          input->buffer_ = puVar2 + 4;
          bVar5 = true;
        }
        if (bVar5 == false) {
          return false;
        }
        AddInt32(this,number,'\x0f',true,local_78.level_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x10':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        pdVar3 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
          bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_78);
        }
        else {
          local_78._0_8_ = *pdVar3;
          input->buffer_ = (uint8 *)(pdVar3 + 1);
          bVar5 = true;
        }
        if (bVar5 == false) {
          return false;
        }
        AddInt64(this,number,'\x10',true,local_78._0_8_,extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x11':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
          local_78._4_4_ = SUB84((ulong)local_78._0_8_ >> 0x20,0);
          local_78.level_ = (int)(char)*puVar2;
          input->buffer_ = puVar2 + 1;
          bVar5 = true;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
        }
        if (bVar5 == false) {
          return false;
        }
        AddInt32(this,number,'\x11',true,
                 -(local_78.level_ & LOGLEVEL_WARNING) ^ local_78.level_ >> 1,extension->descriptor)
        ;
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x12':
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar2 = input->buffer_;
        if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
          input->buffer_ = puVar2 + 1;
          bVar5 = true;
          local_78._0_8_ = (long)(char)uVar1;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_78);
        }
        if (bVar5 == false) {
          return false;
        }
        AddInt64(this,number,'\x12',true,-(ulong)(local_78.level_ & 1) ^ (ulong)local_78._0_8_ >> 1,
                 extension->descriptor);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
    }
    io::CodedInputStream::PopLimit(input,local_34);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    pdVar3 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_78);
    }
    else {
      local_78._0_8_ = *pdVar3;
      input->buffer_ = (uint8 *)(pdVar3 + 1);
      bVar5 = true;
    }
    if (bVar5 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',false,(double)local_78._0_8_,extension->descriptor);
    }
    else {
      SetDouble(this,number,'\x01',(double)local_78._0_8_,extension->descriptor);
    }
    break;
  case '\x02':
    puVar2 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar2 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
    }
    else {
      local_78.level_ = *(undefined4 *)puVar2;
      input->buffer_ = puVar2 + 4;
      bVar5 = true;
    }
    if (bVar5 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',false,(float)local_78.level_,extension->descriptor);
    }
    else {
      SetFloat(this,number,'\x02',(float)local_78.level_,extension->descriptor);
    }
    break;
  case '\x03':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      bVar5 = true;
      local_78._0_8_ = (long)(char)uVar1;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_78);
    }
    if (bVar5 == false) {
      return false;
    }
    pFVar13 = extension->descriptor;
    dVar12 = (double)local_78._0_8_;
    if (extension->is_repeated == true) {
      FVar10 = '\x03';
      goto LAB_00206d22;
    }
    FVar10 = '\x03';
LAB_00206eb0:
    SetInt64(this,number,FVar10,(int64)dVar12,pFVar13);
    break;
  case '\x04':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      bVar5 = true;
      local_78._0_8_ = (long)(char)uVar1;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_78);
    }
    if (bVar5 == false) {
      return false;
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated == true) {
      FVar10 = '\x04';
      goto LAB_00206c87;
    }
    FVar10 = '\x04';
LAB_00206ec7:
    SetUInt64(this,number,FVar10,local_78._0_8_,pFVar13);
    break;
  case '\x05':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
      local_78.level_ = (int)(char)*puVar2;
      input->buffer_ = puVar2 + 1;
      bVar5 = true;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
    }
    if (bVar5 == false) {
      return false;
    }
    pFVar13 = extension->descriptor;
    LVar11 = local_78.level_;
    if (extension->is_repeated == true) {
      FVar10 = '\x05';
      goto LAB_00206bd1;
    }
    FVar10 = '\x05';
LAB_00206e20:
    SetInt32(this,number,FVar10,LVar11,pFVar13);
    break;
  case '\x06':
    pdVar3 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_78);
    }
    else {
      local_78._0_8_ = *pdVar3;
      input->buffer_ = (uint8 *)(pdVar3 + 1);
      bVar5 = true;
    }
    if (bVar5 == false) {
      return false;
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar10 = '\x06';
      goto LAB_00206ec7;
    }
    FVar10 = '\x06';
LAB_00206c87:
    AddUInt64(this,number,FVar10,false,local_78._0_8_,pFVar13);
    break;
  case '\a':
    puVar2 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar2 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
    }
    else {
      local_78.level_ = *(undefined4 *)puVar2;
      input->buffer_ = puVar2 + 4;
      bVar5 = true;
    }
    if (bVar5 == false) {
      return false;
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated == true) {
      FVar10 = '\a';
      goto LAB_00206c10;
    }
    FVar10 = '\a';
LAB_00206eef:
    SetUInt32(this,number,FVar10,local_78.level_,pFVar13);
    break;
  case '\b':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
      local_78.level_ = (int)(char)*puVar2;
      input->buffer_ = puVar2 + 1;
      bVar5 = true;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
    }
    if (bVar5 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',false,local_78.level_ != LOGLEVEL_INFO,extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',local_78.level_ != LOGLEVEL_INFO,extension->descriptor);
    }
    break;
  case '\t':
    if (extension->is_repeated == true) {
      psVar8 = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      psVar8 = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar5 = WireFormatLite::ReadString(input,psVar8);
    break;
  case '\n':
    if (extension->is_repeated == true) {
      pMVar9 = AddMessage(this,number,'\n',(extension->field_3).message_prototype,
                          extension->descriptor);
    }
    else {
      pMVar9 = MutableMessage(this,number,'\n',(extension->field_3).message_prototype,
                              extension->descriptor);
    }
    iVar7 = input->recursion_depth_;
    input->recursion_depth_ = iVar7 + 1;
    if (input->recursion_limit_ <= iVar7) {
      return false;
    }
    iVar7 = (*pMVar9->_vptr_MessageLite[8])(pMVar9,input);
    if ((char)iVar7 == '\0') {
      return false;
    }
    if (0 < input->recursion_depth_) {
      input->recursion_depth_ = input->recursion_depth_ + -1;
    }
    if (input->last_tag_ != number * 8 + 4U) {
      return false;
    }
    return true;
  case '\v':
    if (extension->is_repeated == true) {
      pMVar9 = AddMessage(this,number,'\v',(extension->field_3).message_prototype,
                          extension->descriptor);
    }
    else {
      pMVar9 = MutableMessage(this,number,'\v',(extension->field_3).message_prototype,
                              extension->descriptor);
    }
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
      local_78.level_ = (int)(char)*puVar2;
      input->buffer_ = puVar2 + 1;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
      if (!bVar5) {
        return false;
      }
    }
    iVar7 = input->recursion_depth_;
    input->recursion_depth_ = iVar7 + 1;
    if (input->recursion_limit_ <= iVar7) {
      return false;
    }
    limit = io::CodedInputStream::PushLimit(input,local_78.level_);
    iVar7 = (*pMVar9->_vptr_MessageLite[8])(pMVar9,input);
    if ((char)iVar7 == '\0') {
      return false;
    }
    if (input->legitimate_message_end_ != true) {
      return false;
    }
    io::CodedInputStream::PopLimit(input,limit);
    if (input->recursion_depth_ < 1) {
      return true;
    }
    input->recursion_depth_ = input->recursion_depth_ + -1;
    return true;
  case '\f':
    if (extension->is_repeated == true) {
      psVar8 = AddString_abi_cxx11_(this,number,'\f',extension->descriptor);
    }
    else {
      psVar8 = MutableString_abi_cxx11_(this,number,'\f',extension->descriptor);
    }
    bVar5 = WireFormatLite::ReadBytes(input,psVar8);
    break;
  case '\r':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
      local_78.level_ = (int)(char)*puVar2;
      input->buffer_ = puVar2 + 1;
      bVar5 = true;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
    }
    if (bVar5 == false) {
      return false;
    }
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar10 = '\r';
      goto LAB_00206eef;
    }
    FVar10 = '\r';
LAB_00206c10:
    AddUInt32(this,number,FVar10,false,local_78.level_,pFVar13);
    break;
  case '\x0e':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
      local_78.level_ = (int)(char)*puVar2;
      input->buffer_ = puVar2 + 1;
      bVar5 = true;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
    }
    uVar4 = local_78._0_8_;
    if (bVar5 == false) {
      return false;
    }
    LVar11 = local_78.level_;
    bVar6 = (*(extension->field_3).enum_validity_check.func)
                      ((extension->field_3).enum_validity_check.arg,local_78.level_);
    if (bVar6) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',false,LVar11,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',LVar11,extension->descriptor);
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,uVar4 & 0xffffffff);
    }
    break;
  case '\x0f':
    puVar2 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar2 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
    }
    else {
      local_78.level_ = *(undefined4 *)puVar2;
      input->buffer_ = puVar2 + 4;
      bVar5 = true;
    }
    if (bVar5 == false) {
      return false;
    }
    pFVar13 = extension->descriptor;
    LVar11 = local_78.level_;
    if (extension->is_repeated != true) {
      FVar10 = '\x0f';
      goto LAB_00206e20;
    }
    FVar10 = '\x0f';
    goto LAB_00206bd1;
  case '\x10':
    pdVar3 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_78);
    }
    else {
      local_78._0_8_ = *pdVar3;
      input->buffer_ = (uint8 *)(pdVar3 + 1);
      bVar5 = true;
    }
    if (bVar5 == false) {
      return false;
    }
    pFVar13 = extension->descriptor;
    dVar12 = (double)local_78._0_8_;
    if (extension->is_repeated != true) {
      FVar10 = '\x10';
      goto LAB_00206eb0;
    }
    FVar10 = '\x10';
    goto LAB_00206d22;
  case '\x11':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (-1 < (char)*puVar2)) {
      local_78.level_ = (int)(char)*puVar2;
      input->buffer_ = puVar2 + 1;
      bVar5 = true;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_78.level_);
    }
    if (bVar5 == false) {
      return false;
    }
    LVar11 = -(local_78.level_ & LOGLEVEL_WARNING) ^ local_78.level_ >> 1;
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar10 = '\x11';
      goto LAB_00206e20;
    }
    FVar10 = '\x11';
LAB_00206bd1:
    AddInt32(this,number,FVar10,false,LVar11,pFVar13);
    break;
  case '\x12':
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      bVar5 = true;
      local_78._0_8_ = (long)(char)uVar1;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_78);
    }
    if (bVar5 == false) {
      return false;
    }
    dVar12 = (double)(-(ulong)(local_78.level_ & 1) ^ (ulong)local_78._0_8_ >> 1);
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar10 = '\x12';
      goto LAB_00206eb0;
    }
    FVar10 = '\x12';
LAB_00206d22:
    AddInt64(this,number,FVar10,false,(int64)dVar12,pFVar13);
    break;
  default:
    goto LAB_00206f05;
  }
  if (bVar5 == false) {
    return false;
  }
LAB_00206f05:
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(
    int number, const ExtensionInfo& extension,
    io::CodedInputStream* input,
    FieldSkipper* field_skipper) {
  if (extension.is_packed) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)        \
      case WireFormatLite::TYPE_##UPPERCASE:                                   \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPP_LOWERCASE value;                                                 \
          if (!WireFormatLite::ReadPrimitive<                                  \
                  CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(            \
                input, &value)) return false;                                  \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             true, value, extension.descriptor);               \
        }                                                                      \
        break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, true, value,
                    extension.descriptor);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                   \
      case WireFormatLite::TYPE_##UPPERCASE: {                                 \
        CPP_LOWERCASE value;                                                   \
        if (!WireFormatLite::ReadPrimitive<                                    \
                CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(              \
               input, &value)) return false;                                   \
        if (extension.is_repeated) {                                          \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             false, value, extension.descriptor);              \
        } else {                                                               \
          Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,  \
                             extension.descriptor);                            \
        }                                                                      \
      } break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, false, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_STRING, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_STRING,
                        extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_BYTES, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_BYTES,
                        extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_GROUP,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_GROUP,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}